

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_gstream.c
# Opt level: O2

HTS_Boolean
HTS_GStreamSet_create
          (HTS_GStreamSet *gss,HTS_PStreamSet *pss,size_t stage,HTS_Boolean use_log_gain,
          size_t sampling_rate,size_t fperiod,double alpha,double beta,HTS_Boolean *stop,
          double volume,HTS_Audio *audio)

{
  size_t sVar1;
  HTS_Boolean HVar2;
  size_t sVar3;
  HTS_GStream *pHVar4;
  double **ppdVar5;
  double *pdVar6;
  size_t sVar7;
  long lVar8;
  char *message;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  HTS_Vocoder v;
  
  if ((gss->gstream == (HTS_GStream *)0x0) && (gss->gspeech == (double *)0x0)) {
    sVar3 = HTS_PStreamSet_get_nstream(pss);
    gss->nstream = sVar3;
    sVar3 = HTS_PStreamSet_get_total_frame(pss);
    gss->total_frame = sVar3;
    gss->total_nsample = sVar3 * fperiod;
    pHVar4 = (HTS_GStream *)HTS_calloc(gss->nstream,0x10);
    gss->gstream = pHVar4;
    for (uVar9 = 0; uVar9 < gss->nstream; uVar9 = uVar9 + 1) {
      sVar3 = HTS_PStreamSet_get_vector_length(pss,uVar9);
      gss->gstream[uVar9].vector_length = sVar3;
      ppdVar5 = (double **)HTS_calloc(gss->total_frame,8);
      gss->gstream[uVar9].par = ppdVar5;
      for (uVar10 = 0; uVar10 < gss->total_frame; uVar10 = uVar10 + 1) {
        pdVar6 = (double *)HTS_calloc(gss->gstream[uVar9].vector_length,8);
        gss->gstream[uVar9].par[uVar10] = pdVar6;
      }
    }
    pdVar6 = (double *)HTS_calloc(gss->total_nsample,8);
    gss->gspeech = pdVar6;
    for (uVar9 = 0; uVar9 < gss->nstream; uVar9 = uVar9 + 1) {
      HVar2 = HTS_PStreamSet_is_msd(pss,uVar9);
      uVar10 = 0;
      if (HVar2 == '\0') {
        for (; uVar10 < gss->total_frame; uVar10 = uVar10 + 1) {
          pHVar4 = gss->gstream;
          for (uVar11 = 0; uVar11 < pHVar4[uVar9].vector_length; uVar11 = uVar11 + 1) {
            dVar12 = HTS_PStreamSet_get_parameter(pss,uVar9,uVar10,uVar11);
            pHVar4 = gss->gstream;
            pHVar4[uVar9].par[uVar10][uVar11] = dVar12;
          }
        }
      }
      else {
        sVar3 = 0;
        for (; uVar10 < gss->total_frame; uVar10 = uVar10 + 1) {
          HVar2 = HTS_PStreamSet_get_msd_flag(pss,uVar9,uVar10);
          pHVar4 = gss->gstream;
          if (HVar2 == '\x01') {
            for (uVar11 = 0; uVar11 < pHVar4[uVar9].vector_length; uVar11 = uVar11 + 1) {
              dVar12 = HTS_PStreamSet_get_parameter(pss,uVar9,sVar3,uVar11);
              pHVar4 = gss->gstream;
              pHVar4[uVar9].par[uVar10][uVar11] = dVar12;
            }
            sVar3 = sVar3 + 1;
          }
          else {
            sVar1 = pHVar4[uVar9].vector_length;
            for (sVar7 = 0; sVar1 != sVar7; sVar7 = sVar7 + 1) {
              pHVar4[uVar9].par[uVar10][sVar7] = -10000000000.0;
            }
          }
        }
      }
    }
    if ((gss->nstream & 0xfffffffffffffffe) == 2) {
      sVar3 = HTS_PStreamSet_get_vector_length(pss,1);
      if (sVar3 == 1) {
        if ((gss->nstream < 3) || ((gss->gstream[2].vector_length & 1) != 0)) {
          HTS_Vocoder_initialize
                    (&v,gss->gstream->vector_length - 1,stage,use_log_gain,sampling_rate,fperiod);
          if (gss->nstream < 3) {
            sVar3 = 0;
          }
          else {
            sVar3 = gss->gstream[2].vector_length;
          }
          lVar8 = 0;
          uVar9 = 0;
          pdVar6 = (double *)0x0;
          while ((uVar9 < gss->total_frame && (*stop == '\0'))) {
            pHVar4 = gss->gstream;
            if (2 < gss->nstream) {
              pdVar6 = pHVar4[2].par[uVar9];
            }
            HTS_Vocoder_synthesize
                      (&v,pHVar4->vector_length - 1,*pHVar4[1].par[uVar9],pHVar4->par[uVar9],sVar3,
                       pdVar6,alpha,beta,volume,(double *)((long)gss->gspeech + lVar8),audio);
            uVar9 = uVar9 + 1;
            lVar8 = lVar8 + fperiod * 8;
          }
          HTS_Vocoder_clear(&v);
          if (audio == (HTS_Audio *)0x0) {
            return '\x01';
          }
          HTS_Audio_flush(audio);
          return '\x01';
        }
        message = 
        "HTS_GStreamSet_create: The number of low-pass filter coefficient should be odd numbers.";
      }
      else {
        message = "HTS_GStreamSet_create: The size of lf0 static vector should be 1.\n";
      }
    }
    else {
      message = "HTS_GStreamSet_create: The number of streams should be 2 or 3.\n";
    }
    HTS_error(1,message);
    HTS_GStreamSet_clear(gss);
  }
  else {
    HTS_error(1,"HTS_GStreamSet_create: HTS_GStreamSet is not initialized.\n");
  }
  return '\0';
}

Assistant:

HTS_Boolean HTS_GStreamSet_create(HTS_GStreamSet * gss, HTS_PStreamSet * pss, size_t stage, HTS_Boolean use_log_gain, size_t sampling_rate, size_t fperiod, double alpha, double beta, HTS_Boolean * stop, double volume, HTS_Audio * audio)
{
   size_t i, j, k;
   size_t msd_frame;
   HTS_Vocoder v;
   size_t nlpf = 0;
   double *lpf = NULL;

   /* check */
   if (gss->gstream || gss->gspeech) {
      HTS_error(1, "HTS_GStreamSet_create: HTS_GStreamSet is not initialized.\n");
      return FALSE;
   }

   /* initialize */
   gss->nstream = HTS_PStreamSet_get_nstream(pss);
   gss->total_frame = HTS_PStreamSet_get_total_frame(pss);
   gss->total_nsample = fperiod * gss->total_frame;
   gss->gstream = (HTS_GStream *) HTS_calloc(gss->nstream, sizeof(HTS_GStream));
   for (i = 0; i < gss->nstream; i++) {
      gss->gstream[i].vector_length = HTS_PStreamSet_get_vector_length(pss, i);
      gss->gstream[i].par = (double **) HTS_calloc(gss->total_frame, sizeof(double *));
      for (j = 0; j < gss->total_frame; j++)
         gss->gstream[i].par[j] = (double *) HTS_calloc(gss->gstream[i].vector_length, sizeof(double));
   }
   gss->gspeech = (double *) HTS_calloc(gss->total_nsample, sizeof(double));

   /* copy generated parameter */
   for (i = 0; i < gss->nstream; i++) {
      if (HTS_PStreamSet_is_msd(pss, i)) {      /* for MSD */
         for (j = 0, msd_frame = 0; j < gss->total_frame; j++)
            if (HTS_PStreamSet_get_msd_flag(pss, i, j) == TRUE) {
               for (k = 0; k < gss->gstream[i].vector_length; k++)
                  gss->gstream[i].par[j][k] = HTS_PStreamSet_get_parameter(pss, i, msd_frame, k);
               msd_frame++;
            } else
               for (k = 0; k < gss->gstream[i].vector_length; k++)
                  gss->gstream[i].par[j][k] = HTS_NODATA;
      } else {                  /* for non MSD */
         for (j = 0; j < gss->total_frame; j++)
            for (k = 0; k < gss->gstream[i].vector_length; k++)
               gss->gstream[i].par[j][k] = HTS_PStreamSet_get_parameter(pss, i, j, k);
      }
   }

   /* check */
   if (gss->nstream != 2 && gss->nstream != 3) {
      HTS_error(1, "HTS_GStreamSet_create: The number of streams should be 2 or 3.\n");
      HTS_GStreamSet_clear(gss);
      return FALSE;
   }
   if (HTS_PStreamSet_get_vector_length(pss, 1) != 1) {
      HTS_error(1, "HTS_GStreamSet_create: The size of lf0 static vector should be 1.\n");
      HTS_GStreamSet_clear(gss);
      return FALSE;
   }
   if (gss->nstream >= 3 && gss->gstream[2].vector_length % 2 == 0) {
      HTS_error(1, "HTS_GStreamSet_create: The number of low-pass filter coefficient should be odd numbers.");
      HTS_GStreamSet_clear(gss);
      return FALSE;
   }

   /* synthesize speech waveform */
   HTS_Vocoder_initialize(&v, gss->gstream[0].vector_length - 1, stage, use_log_gain, sampling_rate, fperiod);
   if (gss->nstream >= 3)
      nlpf = gss->gstream[2].vector_length;
   for (i = 0; i < gss->total_frame && (*stop) == FALSE; i++) {
      j = i * fperiod;
      if (gss->nstream >= 3)
         lpf = &gss->gstream[2].par[i][0];
      HTS_Vocoder_synthesize(&v, gss->gstream[0].vector_length - 1, gss->gstream[1].par[i][0], &gss->gstream[0].par[i][0], nlpf, lpf, alpha, beta, volume, &gss->gspeech[j], audio);
   }
   HTS_Vocoder_clear(&v);
   if (audio)
      HTS_Audio_flush(audio);

   return TRUE;
}